

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_utctm.cc
# Opt level: O1

int ASN1_UTCTIME_set_string(ASN1_UTCTIME *s,char *str)

{
  int iVar1;
  size_t sVar2;
  int iVar3;
  CBS cbs;
  CBS local_30;
  
  sVar2 = strlen(str);
  iVar3 = 0;
  local_30.data = (uint8_t *)str;
  local_30.len = sVar2;
  iVar1 = CBS_parse_utc_time(&local_30,(tm *)0x0,0);
  if (iVar1 != 0) {
    if (s != (ASN1_UTCTIME *)0x0) {
      iVar1 = ASN1_STRING_set(s,str,(int)sVar2);
      if (iVar1 == 0) {
        return 0;
      }
      s->type = 0x17;
    }
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int ASN1_UTCTIME_set_string(ASN1_UTCTIME *s, const char *str) {
  // Although elsewhere we allow timezone offsets with UTCTime, to be compatible
  // with some existing misissued certificates, this function is used to
  // construct new certificates and can be stricter.
  size_t len = strlen(str);
  CBS cbs;
  CBS_init(&cbs, (const uint8_t *)str, len);
  if (!CBS_parse_utc_time(&cbs, /*out_tm=*/NULL,
                          /*allow_timezone_offset=*/0)) {
    return 0;
  }
  if (s != NULL) {
    if (!ASN1_STRING_set(s, str, len)) {
      return 0;
    }
    s->type = V_ASN1_UTCTIME;
  }
  return 1;
}